

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O1

uint32_t nd_add_m10e(uint32_t *nd,uint32_t ndhi,uint8_t m,int32_t e)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar3 = (ulong)ndhi;
  if (e < 0) {
    iVar1 = e + -8 >> 0x1f;
    iVar4 = (e + -8) / 9 + iVar1;
    iVar5 = iVar4 - iVar1;
    uVar7 = (ulong)((iVar4 - iVar1) + 0x40);
  }
  else {
    uVar7 = (ulong)(uint)e / 9;
    iVar5 = (int)uVar7;
  }
  iVar4 = (ndigits_dec_threshold[e + iVar5 * -9] + 1) * (uint)m;
  do {
    uVar6 = nd[uVar7] + iVar4;
    if (uVar6 < 1000000000) {
      nd[uVar7] = uVar6;
LAB_00111c39:
      bVar2 = false;
    }
    else {
      nd[uVar7] = uVar6 + 0xc4653600;
      if ((int)uVar7 == (int)uVar3) {
        uVar3 = (ulong)((int)uVar3 + 1U & 0x3f);
        nd[uVar3] = 1;
        goto LAB_00111c39;
      }
      uVar7 = (ulong)((int)uVar7 + 1U & 0x3f);
      bVar2 = true;
      iVar4 = 1;
    }
    if (!bVar2) {
      return (uint32_t)uVar3;
    }
  } while( true );
}

Assistant:

static uint32_t nd_add_m10e(uint32_t* nd, uint32_t ndhi, uint8_t m, int32_t e)
{
  uint32_t i, carry;
  if (e >= 0) {
    i = (uint32_t)e/9;
    carry = m * (ndigits_dec_threshold[e - (int32_t)i*9] + 1);
  } else {
    int32_t f = (e-8)/9;
    i = (uint32_t)(64 + f);
    carry = m * (ndigits_dec_threshold[e - f*9] + 1);
  }
  for (;;) {
    uint32_t val = nd[i] + carry;
    if (LJ_UNLIKELY(val >= 1000000000)) {
      val -= 1000000000;
      nd[i] = val;
      if (LJ_UNLIKELY(i == ndhi)) {
	ndhi = (ndhi + 1) & 0x3f;
	nd[ndhi] = 1;
	break;
      }
      carry = 1;
      i = (i + 1) & 0x3f;
    } else {
      nd[i] = val;
      break;
    }
  }
  return ndhi;
}